

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.hpp
# Opt level: O1

HydroProp * __thiscall OpenMD::Mesh::getHydroProp(Mesh *this,RealType viscosity)

{
  double dVar1;
  HydroProp *this_00;
  
  this_00 = (HydroProp *)operator_new(0x280);
  HydroProp::HydroProp(this_00);
  (this_00->cor_).super_Vector<double,_3U>.data_[2] = DAT_00248be0;
  dVar1 = DAT_00248bd8;
  (this_00->cor_).super_Vector<double,_3U>.data_[0] = OpenMD::V3Zero;
  (this_00->cor_).super_Vector<double,_3U>.data_[1] = dVar1;
  this_00->hasCOR_ = true;
  builtin_strncpy(painCave.errMsg,"Mesh was asked to return an analytic HydroProps.\n",0x32);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  return this_00;
}

Assistant:

virtual HydroProp* getHydroProp(RealType viscosity) {
      HydroProp* props = new HydroProp();
      props->setCenterOfResistance(V3Zero);
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Mesh was asked to return an analytic HydroProps.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      return props;
    }